

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_privileged.inc.c
# Opt level: O0

_Bool trans_hfence_bvma(DisasContext_conflict12 *ctx,arg_sfence_vma *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  _Bool _Var1;
  TCGContext_conflict11 *tcg_ctx;
  arg_sfence_vma *a_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->priv_ver < 0x11000) || (_Var1 = has_ext(ctx,0x80), !_Var1)) {
    ctx_local._7_1_ = false;
  }
  else {
    gen_helper_tlb_flush_riscv64(tcg_ctx_00,tcg_ctx_00->cpu_env);
    ctx_local._7_1_ = true;
  }
  return ctx_local._7_1_;
}

Assistant:

static bool trans_hfence_bvma(DisasContext *ctx, arg_sfence_vma *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->priv_ver >= PRIV_VERSION_1_10_0 &&
        has_ext(ctx, RVH)) {
        /* Hpervisor extensions exist */
        /*
         * if (env->priv == PRV_M ||
         *   (env->priv == PRV_S &&
         *    !riscv_cpu_virt_enabled(env) &&
         *    get_field(ctx->mstatus_fs, MSTATUS_TVM))) {
         */
            gen_helper_tlb_flush(tcg_ctx, tcg_ctx->cpu_env);
            return true;
        /* } */
    }
    return false;
}